

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

int cond(LexState *ls)

{
  undefined1 local_28 [8];
  expdesc v;
  LexState *ls_local;
  
  v._16_8_ = ls;
  expr(ls,(expdesc *)local_28);
  if (local_28._0_4_ == VNIL) {
    local_28._0_4_ = VFALSE;
  }
  luaK_goiftrue(*(FuncState **)(v._16_8_ + 0x30),(expdesc *)local_28);
  return v.u.s.aux;
}

Assistant:

static int cond (LexState *ls) {
  /* cond -> exp */
  expdesc v;
  expr(ls, &v);  /* read condition */
  if (v.k == VNIL) v.k = VFALSE;  /* `falses' are all equal here */
  luaK_goiftrue(ls->fs, &v);
  return v.f;
}